

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

void llama_sampler_chain_reset(llama_sampler *smpl)

{
  llama_sampler_context_t pvVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  
  pvVar1 = smpl->ctx;
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x10);
  for (puVar3 = *(undefined8 **)((long)pvVar1 + 8); puVar3 != puVar2; puVar3 = puVar3 + 1) {
    if (*(code **)(*(long *)*puVar3 + 0x18) != (code *)0x0) {
      (**(code **)(*(long *)*puVar3 + 0x18))();
    }
  }
  *(undefined8 *)((long)pvVar1 + 0x20) = 0;
  *(undefined4 *)((long)pvVar1 + 0x28) = 0;
  return;
}

Assistant:

static void llama_sampler_chain_reset(struct llama_sampler * smpl) {
    auto * chain = (llama_sampler_chain *) smpl->ctx;

    for (auto * smpl : chain->samplers) {
        llama_sampler_reset(smpl);
    }

    chain->t_sample_us = 0;
    chain->n_sample    = 0;
}